

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_3.h
# Opt level: O2

int tree_5_3::layorOrder(Btree t)

{
  ostream *poVar1;
  node *pnVar2;
  int iVar3;
  int iVar4;
  Btree pnVar5;
  Btree pnVar6;
  long lVar7;
  long lVar8;
  Btree q [22];
  
  if (t != (Btree)0x0) {
    q[0] = t;
    iVar3 = 0;
    for (lVar7 = -1; lVar8 = (long)iVar3, lVar7 < lVar8; lVar7 = lVar7 + 1) {
      pnVar6 = q[lVar7 + 1];
      printf("%c\t",(ulong)(uint)pnVar6->data);
      if (pnVar6->left != (node *)0x0) {
        iVar3 = iVar3 + 1;
        q[lVar8 + 1] = pnVar6->left;
      }
      if (pnVar6->right != (node *)0x0) {
        lVar8 = (long)iVar3;
        iVar3 = iVar3 + 1;
        q[lVar8 + 1] = pnVar6->right;
      }
    }
  }
  pnVar5 = (Btree)0x1040b0;
  poVar1 = std::operator<<((ostream *)&std::cout,"");
  std::endl<char,std::char_traits<char>>(poVar1);
  pnVar6 = *(Btree *)poVar1;
  toThread(pnVar6,pnVar5);
  toThread(pnVar6,(Btree)0x0);
  pnVar5 = (Btree)(ulong)(uint)pnVar6->data;
  printf("%c\t");
  pnVar6 = pnVar6->left;
  preOrderTraverse(pnVar6);
  pnVar2 = pnVar6->left;
  inOrderTraverse((tree_5_3 *)pnVar2,pnVar5);
  pnVar2 = pnVar2->left;
  postOrderTraverse((tree_5_3 *)pnVar2,pnVar5);
  for (; pnVar2 != (node *)0x0; pnVar2 = pnVar2->left) {
    iVar3 = pnVar2->data;
    iVar4 = (int)pnVar5;
    if (iVar3 == iVar4) goto LAB_001026a6;
    if (iVar3 <= iVar4) {
      if (iVar4 <= iVar3) break;
      pnVar2 = (node *)&pnVar2->right;
    }
  }
  pnVar2 = (node *)0x0;
LAB_001026a6:
  return (int)pnVar2;
}

Assistant:

int layorOrder(Btree t) {
        Btree p = t, q[22];
        int f, r;
        if (p != nullptr) {
            q[0] = p;
            f = -1;
            r = 0;
            while (f < r) {
                p = q[++f];
                printf("%c\t", p->data);
                if (p->left != nullptr)
                    q[++r] = p->left;
                if (p->right != nullptr)
                    q[++r] = p->right;
            }
        }
        std::cout << "" << std::endl;
    }